

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_relocation.hpp
# Opt level: O0

void __thiscall
ELFIO::relocation_section_accessor_template<ELFIO::section>::
generic_set_entry_rela<ELFIO::Elf32_Rela>
          (relocation_section_accessor_template<ELFIO::section> *this,Elf_Xword index,
          Elf64_Addr offset,Elf_Word symbol,uint type,Elf_Sxword addend)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  endianness_convertor *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint32_t *puVar5;
  Elf32_Rela *pEntry;
  endianness_convertor *convertor;
  Elf_Sxword addend_local;
  uint type_local;
  Elf_Word symbol_local;
  Elf64_Addr offset_local;
  Elf_Xword index_local;
  relocation_section_accessor_template<ELFIO::section> *this_local;
  
  this_00 = elfio::get_convertor(this->elf_file);
  iVar2 = (*this->relocation_section->_vptr_section[0x18])();
  iVar3 = (*this->relocation_section->_vptr_section[0xf])();
  puVar5 = (uint32_t *)(CONCAT44(extraout_var,iVar2) + index * CONCAT44(extraout_var_00,iVar3));
  uVar1 = elfio::get_class(this->elf_file);
  if (uVar1 == '\x01') {
    puVar5[1] = symbol * 0x100 + (type & 0xff);
  }
  else {
    puVar5[1] = type;
  }
  *puVar5 = (uint32_t)offset;
  puVar5[2] = (uint32_t)addend;
  uVar4 = endianness_convertor::operator()(this_00,*puVar5);
  *puVar5 = uVar4;
  uVar4 = endianness_convertor::operator()(this_00,puVar5[1]);
  puVar5[1] = uVar4;
  uVar4 = endianness_convertor::operator()(this_00,puVar5[2]);
  puVar5[2] = uVar4;
  return;
}

Assistant:

void generic_set_entry_rela( Elf_Xword  index,
                                 Elf64_Addr offset,
                                 Elf_Word   symbol,
                                 unsigned   type,
                                 Elf_Sxword addend )
    {
        const endianness_convertor& convertor = elf_file.get_convertor();

        T* pEntry = const_cast<T*>( reinterpret_cast<const T*>(
            relocation_section->get_data() +
            index * relocation_section->get_entry_size() ) );

        if ( elf_file.get_class() == ELFCLASS32 ) {
            pEntry->r_info = ELF32_R_INFO( (Elf_Xword)symbol, type );
        }
        else {
            pEntry->r_info = ELF64_R_INFO( (Elf_Xword)symbol, type );
        }
        pEntry->r_offset = decltype( pEntry->r_offset )( offset );
        pEntry->r_addend = decltype( pEntry->r_addend )( addend );
        pEntry->r_offset = convertor( pEntry->r_offset );
        pEntry->r_info   = convertor( pEntry->r_info );
        pEntry->r_addend = convertor( pEntry->r_addend );
    }